

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PipelineRegressor::MergeFrom(PipelineRegressor *this,PipelineRegressor *from)

{
  void *pvVar1;
  LogMessage *other;
  Pipeline *pPVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x39e);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (PipelineRegressor *)&_PipelineRegressor_default_instance_) &&
     (from->pipeline_ != (Pipeline *)0x0)) {
    if (this->pipeline_ == (Pipeline *)0x0) {
      pPVar2 = (Pipeline *)operator_new(0x48);
      Pipeline::Pipeline(pPVar2);
      this->pipeline_ = pPVar2;
    }
    pPVar2 = from->pipeline_;
    if (pPVar2 == (Pipeline *)0x0) {
      pPVar2 = (Pipeline *)&_Pipeline_default_instance_;
    }
    Pipeline::MergeFrom(this->pipeline_,pPVar2);
  }
  return;
}

Assistant:

void PipelineRegressor::MergeFrom(const PipelineRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.PipelineRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_pipeline()) {
    mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
  }
}